

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void FilterLoop26_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int thresh2;
  int local_14;
  uint8_t *local_8;
  
  local_14 = in_ECX;
  local_8 = in_RDI;
  while (0 < local_14) {
    iVar1 = NeedsFilter2_C(local_8,in_ESI,in_R8D * 2 + 1,in_R9D);
    if (iVar1 != 0) {
      iVar1 = Hev(local_8,in_ESI,thresh2);
      if (iVar1 == 0) {
        DoFilter6_C(local_8,in_ESI);
      }
      else {
        DoFilter2_C(local_8,in_ESI);
      }
    }
    local_8 = local_8 + in_EDX;
    local_14 = local_14 + -1;
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop26_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter6_C(p, hstride);
      }
    }
    p += vstride;
  }
}